

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  Vec_Set_t *pVVar4;
  uint *__dest;
  int **ppiVar5;
  Vec_Wrd_t *p;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Gla_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  Gla_Man_t *pGVar14;
  abctime aVar15;
  Abs_Par_t *pAVar16;
  Gia_Man_t *pGVar17;
  abctime aVar18;
  Vec_Int_t *pVVar19;
  Prf_Man_t *pPVar20;
  Vec_Int_t *pVVar21;
  Vec_Wrd_t *pVVar22;
  Abc_Frame_t *pAbc;
  Abc_Cex_t *pAVar23;
  Vec_Int_t *pVVar24;
  Gla_Obj_t *pGVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  Gia_Man_t *pGVar30;
  sat_solver2 *psVar31;
  Gla_Man_t *pGVar32;
  char *pcVar33;
  uint *in_R8;
  uint nCoreSize;
  ulong uVar34;
  double dVar35;
  double local_488;
  int Status;
  double local_478;
  undefined8 local_470;
  uint local_468;
  int local_464;
  undefined1 local_460 [36];
  int nConfls;
  Gla_Obj_t *local_438;
  Gla_Man_t *local_430;
  Gia_Man_t *local_428;
  Vec_Int_t *local_420;
  char Command [1000];
  
  pAVar16 = pPars;
  pGVar12 = (Gla_Obj_t *)Abc_Clock();
  iVar10 = (int)pAVar16;
  if (pAig->vCos->nSize - pAig->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if ((pPars->nFramesMax != 0) && (pPars->nFramesMax < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  pGVar13 = Gia_ManPo(pAig,iVar10);
  if ((~*(ulong *)(pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)) &
      0x1fffffff1fffffff) == 0) {
    pGVar13 = Gia_ManPo(pAig,iVar10);
    if ((pGVar13->field_0x3 & 0x20) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      return 1;
    }
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pAVar23 = Abc_CexMakeTriv(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,1,0);
    pAig->pCexSeq = pAVar23;
    puts("Sequential miter is trivially SAT.");
    return 0;
  }
  local_460._16_8_ = &pAig->vGateClasses;
  iVar10 = -1;
  local_438 = pGVar12;
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    if (fStartVta == 0) {
      pVVar24 = Vec_IntStart(pAig->nObjs);
      pAig->vGateClasses = pVVar24;
      iVar28 = 0;
      Vec_IntWriteEntry(pVVar24,0,1);
      pVVar24 = pAig->vGateClasses;
      pGVar13 = Gia_ManPo(pAig,iVar28);
      iVar28 = Gia_ObjFaninId0p(pAig,pGVar13);
      Vec_IntWriteEntry(pVVar24,iVar28,1);
    }
    else {
      iVar10 = pPars->nFramesMax;
      iVar28 = pPars->nFramesStart;
      iVar11 = pPars->nTimeOut;
      iVar3 = pPars->fDumpVabs;
      pPars->nFramesMax = iVar28;
      iVar7 = 2;
      if (iVar28 / 2 < 2) {
        iVar7 = iVar28 / 2;
      }
      pPars->nFramesStart = iVar7 + 1;
      pPars->nTimeOut = 0x14;
      pPars->fDumpVabs = 0;
      local_464 = Gia_VtaPerformInt(pAig,pPars);
      pPars->nFramesMax = iVar10;
      pPars->nFramesStart = iVar28;
      pPars->nTimeOut = iVar11;
      pPars->fDumpVabs = iVar3;
      Vec_IntFreeP((Vec_Int_t **)local_460._16_8_);
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        pVVar24 = Gia_VtaConvertToGla(pAig,pAig->vObjClasses);
        pAig->vGateClasses = pVVar24;
      }
      Vec_IntFreeP(&pAig->vObjClasses);
      if (local_464 == 0) {
        return 0;
      }
      pGVar12 = local_438;
      iVar10 = local_464;
      if (*(Vec_Int_t **)local_460._16_8_ == (Vec_Int_t *)0x0) {
        return local_464;
      }
    }
  }
  local_428 = pAig;
  pGVar14 = Gla_ManStart(pAig,pPars);
  iVar11 = (int)pAig;
  aVar15 = Abc_Clock();
  pGVar14->timeInit = aVar15 - (long)pGVar12;
  pAVar16 = pGVar14->pPars;
  iVar28 = pAVar16->nTimeOut;
  local_430 = pGVar14;
  if ((long)iVar28 != 0) {
    psVar31 = pGVar14->pSat;
    aVar15 = Abc_Clock();
    psVar31->nRuntimeLimit = aVar15 + (long)iVar28 * 1000000;
    pAVar16 = local_430->pPars;
  }
  pGVar14 = local_430;
  if (pAVar16->fVerbose != 0) {
    Abc_Print(iVar11,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(iVar11,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pPars->nFramesMax,(ulong)(uint)pPars->nConfLimit,
              (ulong)(uint)pPars->nTimeOut,(ulong)(uint)pPars->nRatioMin);
    in_R8 = (uint *)(ulong)(uint)pPars->nLearnedPerce;
    Abc_Print(iVar11,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta);
    Abc_Print(iVar11,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  local_460._8_4_ = 0;
  local_470 = (double)((ulong)local_470._4_4_ << 0x20);
  uVar26 = 0;
  uVar9 = 0;
  local_464 = iVar10;
  local_460._24_8_ = pPars;
LAB_004a4686:
  pVVar24 = (Vec_Int_t *)(ulong)uVar9;
  iVar10 = pGVar14->pPars->nFramesMax;
  local_460._32_4_ = uVar26;
  if ((int)uVar9 < iVar10 || iVar10 == 0) {
    local_460._12_4_ = (undefined4)(pGVar14->pSat->stats).conflicts;
    pGVar14->pPars->iFrame = uVar9;
    Gia_GlaAddTimeFrame(pGVar14,uVar9);
    local_468 = uVar9 + 1;
    local_478 = (double)((ulong)local_478 & 0xffffffff00000000);
    do {
      aVar15 = Abc_Clock();
      pVVar21 = pVVar24;
      pGVar17 = (Gia_Man_t *)
                Gla_ManUnsatCore(pGVar14,uVar9,pGVar14->pSat,pPars->nConfLimit,(int)in_R8,&Status,
                                 &nConfls);
      psVar31 = pGVar14->pSat;
      if (Status == -1) {
LAB_004a4d5c:
        local_460._0_8_ = pGVar17;
        Prf_ManStopP(&psVar31->pPrf2);
        break;
      }
      if (psVar31->nRuntimeLimit != 0) {
        aVar18 = Abc_Clock();
        psVar31 = pGVar14->pSat;
        if (psVar31->nRuntimeLimit < aVar18) goto LAB_004a4d5c;
      }
      if (Status == 1) {
        local_460._0_8_ = pGVar17;
        Prf_ManStopP(&psVar31->pPrf2);
        uVar29 = (uint)pVVar21;
        aVar18 = Abc_Clock();
        pGVar14->timeUnsat = pGVar14->timeUnsat + (aVar18 - aVar15);
        goto LAB_004a4b39;
      }
      aVar18 = Abc_Clock();
      pGVar14->timeSat = pGVar14->timeSat + (aVar18 - aVar15);
      if (Status != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      pGVar14->nCexes = pGVar14->nCexes + 1;
      iVar10 = Abc_FrameIsBridgeMode();
      uVar26 = local_478._0_4_;
      if ((iVar10 != 0) && ((int)local_470 != 0)) {
        Gia_GlaSendCancel((Gla_Man_t *)psVar31,(int)pVVar21);
        local_470 = (double)((ulong)local_470 & 0xffffffff00000000);
      }
      Abc_Clock();
      if (pPars->fAddLayer == 0) {
        pVVar19 = Gla_ManRefinement(pGVar14);
        uVar29 = (uint)pVVar21;
        if (pVVar19 == (Vec_Int_t *)0x0) goto LAB_004a4b07;
      }
      else {
        pVVar19 = Gla_ManCollectPPis(pGVar14,pVVar21);
      }
      psVar31 = pGVar14->pSat;
      if (uVar26 == 0) {
        if (psVar31->qhead != psVar31->qtail) {
          __assert_fail("s->qhead == s->qtail",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                        ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
        }
        iVar10 = psVar31->size;
        psVar31->iVarPivot = iVar10;
        psVar31->iTrailPivot = psVar31->qhead;
        pVVar4 = psVar31->pPrf1;
        if (pVVar4 != (Vec_Set_t *)0x0) {
          psVar31->hProofPivot =
               (pVVar4->iPage << ((byte)pVVar4->nPageSize & 0x1f)) +
               (int)*pVVar4->pPages[pVVar4->iPage];
        }
        __dest = psVar31->activity2;
        *(undefined8 *)(psVar31->Mem).BookMarkE = *(undefined8 *)(psVar31->Mem).nEntries;
        iVar28 = (psVar31->Mem).iPage[0];
        bVar2 = (byte)(psVar31->Mem).nPageSize;
        ppiVar5 = (psVar31->Mem).pPages;
        (psVar31->Mem).BookMarkH[0] = iVar28 << (bVar2 & 0x1f) | *ppiVar5[iVar28];
        iVar28 = (psVar31->Mem).iPage[1];
        in_R8 = (uint *)ppiVar5[iVar28];
        (psVar31->Mem).BookMarkH[1] = iVar28 << (bVar2 & 0x1f) | *in_R8;
        if (__dest != (uint *)0x0) {
          psVar31->var_inc2 = psVar31->var_inc;
          memcpy(__dest,psVar31->activity,(long)iVar10 << 2);
          psVar31 = pGVar14->pSat;
        }
        pGVar14->vAddedNew->nSize = 0;
        pGVar14->nAbsOld = pGVar14->vAbs->nSize;
        if (psVar31->pPrf2 != (Prf_Man_t *)0x0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        local_460._8_4_ = pGVar14->nSatVars;
        if (psVar31->pPrf1 == (Vec_Set_t *)0x0) {
          pPVar20 = (Prf_Man_t *)calloc(1,0x30);
          pPVar20->iFirst = -1;
          pPVar20->iFirst2 = -1;
          pVVar22 = Vec_WrdAlloc(1000);
          pPVar20->vInfo = pVVar22;
          pVVar21 = Vec_IntAlloc(1000);
          pPVar20->vSaved = pVVar21;
          pGVar14->pSat->pPrf2 = pPVar20;
          pGVar14->nProofIds = 0;
          Vec_IntFill(pGVar14->vProofIds,pGVar14->pGia->nObjs,-1);
          pPVar20 = pGVar14->pSat->pPrf2;
          if (pPVar20->iFirst != -1) {
            __assert_fail("p->iFirst == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
          }
          uVar29 = pVVar19->nSize;
          pVVar21 = pGVar14->vProofIds;
          pPVar20->iFirst = (pGVar14->pSat->stats).learnts;
          pPVar20->nWords = (((int)uVar29 >> 6) + 1) - (uint)((uVar29 & 0x3f) == 0);
          pPVar20->vId2Pr = pVVar21;
          pPVar20->pInfo = (word *)0x0;
          pPVar20->vInfo->nSize = 0;
        }
      }
      else {
        pPVar20 = psVar31->pPrf2;
        pPars = (Abs_Par_t *)local_460._24_8_;
        if (pPVar20 != (Prf_Man_t *)0x0) {
          if (pPVar20->iFirst < 0) {
            __assert_fail("p->iFirst >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          if (pPVar20->pInfo != (word *)0x0) {
            __assert_fail("p->pInfo == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          uVar29 = pVVar19->nSize + pGVar14->nProofIds;
          iVar10 = pPVar20->nWords;
          if (iVar10 * 0x40 <= (int)uVar29) {
            iVar28 = (((int)uVar29 >> 6) + 1) - (uint)((uVar29 & 0x3f) == 0);
            iVar11 = iVar10 * 2;
            if (iVar28 == iVar11 || SBORROW4(iVar28,iVar11) != iVar28 + iVar10 * -2 < 0) {
              iVar28 = iVar11;
            }
            uVar27 = (long)pPVar20->vInfo->nSize / (long)iVar10;
            iVar10 = (int)uVar27;
            local_420 = pVVar19;
            pVVar22 = Vec_WrdAlloc((iVar10 + 1000) * iVar28);
            uVar34 = 0;
            uVar27 = uVar27 & 0xffffffff;
            if (iVar10 < 1) {
              uVar27 = uVar34;
            }
            while( true ) {
              p = pPVar20->vInfo;
              iVar10 = (int)uVar34;
              if (iVar10 == (int)uVar27) break;
              iVar11 = pPVar20->nWords;
              uVar26 = iVar11 * iVar10;
              if (((int)uVar26 < 0) || (p->nSize <= (int)uVar26)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                              ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              pPVar20->pInfo = p->pArray + uVar26;
              for (uVar34 = 0; (long)uVar34 < (long)iVar11; uVar34 = uVar34 + 1) {
                Vec_WrdPush(pVVar22,pPVar20->pInfo[uVar34]);
                iVar11 = pPVar20->nWords;
              }
              for (; (int)uVar34 < iVar28; uVar34 = (ulong)((int)uVar34 + 1)) {
                Vec_WrdPush(pVVar22,0);
              }
              uVar34 = (ulong)(iVar10 + 1);
            }
            Vec_WrdFree(p);
            pPVar20->vInfo = pVVar22;
            pPVar20->nWords = iVar28;
            pPVar20->pInfo = (word *)0x0;
            pVVar19 = local_420;
            pGVar12 = local_438;
            pPars = (Abs_Par_t *)local_460._24_8_;
            pGVar14 = local_430;
            uVar26 = local_478._0_4_;
          }
        }
      }
      Gia_GlaAddToAbs(pGVar14,pVVar19,1);
      Gia_GlaAddOneSlice(pGVar14,uVar9,pVVar19);
      Vec_IntFree(pVVar19);
      if (pGVar14->pPars->fVerbose != 0) {
        iVar10 = (int)(pGVar14->pSat->stats).conflicts - local_460._12_4_;
        aVar15 = Abc_Clock();
        in_R8 = (uint *)(ulong)uVar26;
        Gla_ManAbsPrintFrame(pGVar14,-1,local_468,iVar10,uVar26,aVar15 - (long)pGVar12);
      }
      local_478 = (double)CONCAT44(local_478._4_4_,uVar26 + 1);
    } while( true );
  }
  goto LAB_004a4d6d;
LAB_004a4b07:
  local_460._0_8_ = pGVar17;
  Prf_ManStopP(&pGVar14->pSat->pPrf2);
  pAVar23 = pGVar14->pGia->pCexSeq;
  pGVar14->pGia->pCexSeq = (Abc_Cex_t *)0x0;
  if (pAVar23 != (Abc_Cex_t *)0x0) {
    if (pGVar14->pPars->fVerbose != 0) {
      putchar(10);
    }
    pGVar17 = local_428;
    free(local_428->pCexSeq);
    pGVar17->pCexSeq = pAVar23;
    iVar10 = 0;
    iVar28 = Gia_ManVerifyCex(pGVar17,pAVar23,0);
    iVar11 = (int)pGVar17;
    if (iVar28 == 0) {
      Abc_Print(iVar11,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar11,"Counter-example detected in frame %d.  ",pVVar24);
    pGVar14->pPars->iFrame = pAVar23->iFrame + -1;
    pAVar16 = (Abs_Par_t *)local_460._16_8_;
    Vec_IntFreeP((Vec_Int_t **)local_460._16_8_);
    iVar28 = (int)pAVar16;
    goto LAB_004a4fee;
  }
LAB_004a4b39:
  if (Status != 1) {
    __assert_fail("Status == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  nCoreSize = 1;
  iVar10 = local_478._0_4_;
  if (pGVar17 != (Gia_Man_t *)0x0) {
    nCoreSize = *(int *)((long)&pGVar17->pName + 4) + 1;
    pGVar30 = pGVar17;
    Gia_GlaAddToCounters(pGVar14,(Vec_Int_t *)pGVar17);
    uVar29 = (uint)pGVar30;
  }
  if (iVar10 == 0) {
    piVar1 = &pGVar14->pPars->nFramesNoChange;
    *piVar1 = *piVar1 + 1;
    pGVar32 = (Gla_Man_t *)local_460;
    Vec_IntFreeP((Vec_Int_t **)pGVar32);
    uVar26 = 0;
  }
  else {
    pGVar14->pPars->nFramesNoChange = 0;
    sat_solver2_rollback(pGVar14->pSat);
    Gla_ManRollBack(pGVar14);
    pGVar14->nSatVars = local_460._8_4_;
    Gia_GlaAddToAbs(pGVar14,(Vec_Int_t *)pGVar17,0);
    Gia_GlaAddOneSlice(pGVar14,uVar9,(Vec_Int_t *)pGVar17);
    Vec_IntFree((Vec_Int_t *)pGVar17);
    aVar15 = Abc_Clock();
    uVar29 = uVar9;
    local_460._0_8_ =
         Gla_ManUnsatCore(pGVar14,uVar9,pGVar14->pSat,pPars->nConfLimit,(int)in_R8,&Status,&nConfls)
    ;
    aVar18 = Abc_Clock();
    pGVar14->timeUnsat = pGVar14->timeUnsat + (aVar18 - aVar15);
    pGVar32 = (Gla_Man_t *)local_460;
    Vec_IntFreeP((Vec_Int_t **)pGVar32);
    if (Status == -1) goto LAB_004a4d6d;
    uVar26 = local_478._0_4_;
    if (Status == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
    }
  }
  if (pGVar14->pPars->fVerbose != 0) {
    iVar10 = (int)(pGVar14->pSat->stats).conflicts - local_460._12_4_;
    aVar15 = Abc_Clock();
    in_R8 = (uint *)(ulong)uVar26;
    pGVar32 = pGVar14;
    uVar29 = nCoreSize;
    Gla_ManAbsPrintFrame(pGVar14,nCoreSize,local_468,iVar10,uVar26,aVar15 - (long)pGVar12);
  }
  if ((local_460._32_4_ != 0 && 2 < uVar9) && uVar26 == 0) {
    iVar10 = Abc_FrameIsBridgeMode();
    if (iVar10 != 0) {
      if ((int)local_470 != 0) {
        Gia_GlaSendCancel(pGVar32,uVar29);
      }
      Gia_GlaSendAbsracted(pGVar14,uVar29);
      local_470 = (double)CONCAT44(local_470._4_4_,1);
    }
    if (pGVar14->pPars->fDumpVabs != 0) {
      Abc_FrameSetStatus(-1);
      Abc_FrameSetCex((Abc_Cex_t *)0x0);
      Abc_FrameSetNFrames(local_468);
      pcVar33 = pGVar14->pPars->pFileVabs;
      if (pcVar33 == (char *)0x0) {
        pcVar33 = "glabs.aig";
      }
      pcVar33 = Extra_FileNameGenericAppend(pcVar33,".status");
      sprintf(Command,"write_status %s",pcVar33);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,Command);
      Gia_GlaDumpAbsracted(pGVar14,pPars->fVerbose);
    }
  }
  iVar10 = Gia_GlaAbsCount(pGVar14,0,0);
  uVar9 = local_468;
  if (((100 - pPars->nRatioMin) * (pGVar14->nObjs + -1)) / 100 <= iVar10) goto code_r0x004a4d55;
  goto LAB_004a4686;
code_r0x004a4d55:
  Status = -1;
LAB_004a4d6d:
  if ((pGVar14->pPars->fVerbose != 0) && (Status == -1)) {
    putchar(10);
  }
  uVar8 = local_460._16_8_;
  Vec_IntFreeP((Vec_Int_t **)local_460._16_8_);
  pGVar32 = pGVar14;
  pVVar21 = Gla_ManTranslate(pGVar14);
  iVar10 = local_464;
  iVar28 = (int)pGVar32;
  *(Vec_Int_t **)uVar8 = pVVar21;
  pAVar16 = pGVar14->pPars;
  if (Status == -1) {
    if ((pAVar16->nTimeOut == 0) || (aVar15 = Abc_Clock(), aVar15 < pGVar14->pSat->nRuntimeLimit)) {
      uVar26 = pPars->nConfLimit;
      if ((uVar26 == 0) || ((int)(pGVar14->pSat->stats).conflicts < (int)uVar26)) {
        iVar11 = Gia_GlaAbsCount(pGVar14,0,0);
        iVar28 = 100;
        if (iVar11 < ((100 - pPars->nRatioMin) * (pGVar14->nObjs + -1)) / 100) {
          Abc_Print(100,"Abstraction stopped for unknown reason in frame %d.  ",pVVar24);
          goto LAB_004a4fee;
        }
        pcVar33 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        pVVar19 = (Vec_Int_t *)(ulong)(uint)pPars->nRatioMin;
        pVVar21 = pVVar24;
        goto LAB_004a4dc7;
      }
      uVar9 = pGVar14->pPars->nFramesNoChange;
      pcVar33 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      uVar26 = pGVar14->pPars->nTimeOut;
      uVar9 = pGVar14->pPars->nFramesNoChange;
      pcVar33 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar28,pcVar33,(ulong)uVar26,pVVar24,(ulong)uVar9);
  }
  else {
    pAVar16->iFrame = pAVar16->iFrame + 1;
    pcVar33 = "GLA completed %d frames with a %d-stable abstraction.  ";
    pVVar21 = (Vec_Int_t *)(ulong)(uint)pAVar16->nFramesNoChange;
    pVVar19 = pVVar24;
LAB_004a4dc7:
    Abc_Print(iVar28,pcVar33,pVVar19,pVVar21);
  }
LAB_004a4fee:
  aVar15 = Abc_Clock();
  Abc_Print(iVar28,"%s =","Time");
  Abc_Print(iVar28,"%9.2f sec\n",(double)(aVar15 - (long)pGVar12) / 1000000.0);
  if (pGVar14->pPars->fVerbose != 0) {
    aVar15 = Abc_Clock();
    pGVar14->timeOther =
         aVar15 - ((long)pGVar12->Fanins +
                  pGVar14->timeCex + pGVar14->timeSat + pGVar14->timeUnsat + pGVar14->timeInit + -8)
    ;
    Abc_Print(iVar28,"%s =","Runtime: Initializing");
    local_478 = (double)pGVar14->timeInit / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    local_488 = 0.0;
    dVar35 = 0.0;
    if (pGVar25 != pGVar12) {
      local_470 = (double)pGVar14->timeInit * 100.0;
      aVar15 = Abc_Clock();
      dVar35 = local_470 / (double)(aVar15 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,dVar35);
    Abc_Print(iVar28,"%s =","Runtime: Solver UNSAT");
    local_478 = (double)pGVar14->timeUnsat / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    if (pGVar25 != pGVar12) {
      lVar6 = pGVar14->timeUnsat;
      aVar15 = Abc_Clock();
      local_488 = ((double)lVar6 * 100.0) / (double)(aVar15 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,local_488);
    Abc_Print(iVar28,"%s =","Runtime: Solver SAT  ");
    local_478 = (double)pGVar14->timeSat / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    local_488 = 0.0;
    dVar35 = 0.0;
    if (pGVar25 != pGVar12) {
      local_470 = (double)pGVar14->timeSat * 100.0;
      aVar15 = Abc_Clock();
      dVar35 = local_470 / (double)(aVar15 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,dVar35);
    Abc_Print(iVar28,"%s =","Runtime: Refinement  ");
    local_478 = (double)pGVar14->timeCex / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    if (pGVar25 != pGVar12) {
      lVar6 = pGVar14->timeCex;
      aVar15 = Abc_Clock();
      local_488 = ((double)lVar6 * 100.0) / (double)(aVar15 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,local_488);
    Abc_Print(iVar28,"%s =","Runtime: Other       ");
    local_478 = (double)pGVar14->timeOther / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    local_488 = 0.0;
    dVar35 = 0.0;
    if (pGVar25 != pGVar12) {
      local_470 = (double)pGVar14->timeOther * 100.0;
      aVar15 = Abc_Clock();
      dVar35 = local_470 / (double)(aVar15 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,dVar35);
    Abc_Print(iVar28,"%s =","Runtime: TOTAL       ");
    aVar15 = Abc_Clock();
    local_478 = (double)(aVar15 - (long)pGVar12) / 1000000.0;
    pGVar25 = (Gla_Obj_t *)Abc_Clock();
    if (pGVar25 != pGVar12) {
      aVar15 = Abc_Clock();
      aVar18 = Abc_Clock();
      local_488 = ((double)(aVar15 - (long)pGVar12) * 100.0) / (double)(aVar18 - (long)pGVar12);
    }
    Abc_Print(iVar28,"%9.2f sec (%6.2f %%)\n",local_478,local_488);
    Gla_ManReportMemory(pGVar14);
  }
  Gla_ManStop(pGVar14);
  fflush(_stdout);
  return iVar10;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}